

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

bool __thiscall duckdb::ARTKey::operator>(ARTKey *this,ARTKey *key)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->len;
  uVar2 = key->len;
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    uVar6 = uVar5;
    if (uVar4 == uVar5) goto LAB_01933069;
    if (key->data[uVar5] < this->data[uVar5]) {
      uVar6 = 1;
      goto LAB_01933069;
    }
    uVar6 = uVar5 + 1;
  } while (key->data[uVar5] <= this->data[uVar5]);
  uVar6 = 0;
LAB_01933069:
  bVar3 = (byte)uVar6;
  if (uVar4 <= uVar5) {
    bVar3 = uVar2 < uVar1;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ARTKey::operator>(const ARTKey &key) const {
	for (idx_t i = 0; i < MinValue(len, key.len); i++) {
		if (data[i] > key.data[i]) {
			return true;
		} else if (data[i] < key.data[i]) {
			return false;
		}
	}
	return len > key.len;
}